

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carver.cpp
# Opt level: O0

Mat * __thiscall
carver::Carver::removeSeams
          (Carver *this,Mat *source,vector<int,_std::allocator<int>_> *verticalSeam,
          vector<int,_std::allocator<int>_> *horizontalSeam)

{
  Mat *in_RDX;
  Mat *in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  Mat *in_stack_00000010;
  Carver *in_stack_00000018;
  Mat *target;
  Mat *this_00;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffee8;
  Mat *in_stack_fffffffffffffef0;
  Carver *in_stack_fffffffffffffef8;
  Mat local_90 [103];
  undefined1 local_29;
  
  local_29 = 0;
  this_00 = in_RDI;
  cv::Mat::Mat(in_RDI,in_RDX);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef0,
             in_stack_fffffffffffffee8);
  removeVerticalSeam(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  cv::Mat::operator=(in_RDI,local_90);
  cv::Mat::~Mat(local_90);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef0,
             in_stack_fffffffffffffee8);
  removeHorizontalSeam(in_stack_00000018,in_stack_00000010,in_stack_00000008);
  cv::Mat::operator=(in_RDI,(Mat *)&stack0xfffffffffffffee8);
  cv::Mat::~Mat((Mat *)&stack0xfffffffffffffee8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  return this_00;
}

Assistant:

cv::Mat Carver::removeSeams(cv::Mat &source, vector<int> verticalSeam,
                            vector<int> horizontalSeam) {
    cv::Mat target = source;
    target = removeVerticalSeam(source, verticalSeam);
    target = removeHorizontalSeam(target, horizontalSeam);
    return target;
}